

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall cs_impl::runtime_cs_ext::create_co_s(runtime_cs_ext *this,var *func,array *args)

{
  char *pcVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  int iVar5;
  routine_t rVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar7;
  object_method *poVar8;
  callable *pcVar9;
  type_info *ptVar10;
  function *pfVar11;
  long *plVar12;
  initializer_list<cs_impl::any> __l;
  allocator_type local_171;
  any local_170;
  shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> local_168;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_158;
  uint *local_140;
  long local_138;
  uint local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint *local_120;
  long local_118;
  uint local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  fiber_callable local_100;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_90;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_78;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_58;
  
  if (func->mDat == (proxy *)0x0) {
    puVar7 = &void::typeinfo;
  }
  else {
    iVar5 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar7 = (undefined *)CONCAT44(extraout_var,iVar5);
  }
  pcVar1 = *(char **)(puVar7 + 8);
  if ((pcVar1 != "N2cs8callableE") &&
     ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8callableE"), iVar5 != 0)))) {
    if (func->mDat == (proxy *)0x0) {
      puVar7 = &void::typeinfo;
    }
    else {
      iVar5 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar7 = (undefined *)CONCAT44(extraout_var_00,iVar5);
    }
    pcVar1 = *(char **)(puVar7 + 8);
    if ((pcVar1 == "N2cs13object_methodE") ||
       ((*pcVar1 != '*' && (iVar5 = strcmp(pcVar1,"N2cs13object_methodE"), iVar5 == 0)))) {
      poVar8 = any::const_val<cs::object_method>(func);
      pcVar9 = any::const_val<cs::callable>(&poVar8->callable);
      ptVar10 = std::
                function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                ::target_type(&pcVar9->mFunc);
      pcVar1 = *(char **)(ptVar10 + 8);
      if ((pcVar1 != "N2cs8functionE") &&
         ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8functionE"), iVar5 != 0)))) {
        plVar12 = (long *)__cxa_allocate_exception(0x20);
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Only can create coroutine from covscript function.","");
        *plVar12 = (long)(plVar12 + 2);
        if (local_140 == &local_130) {
          *(uint *)(plVar12 + 2) = local_130;
          *(undefined4 *)((long)plVar12 + 0x14) = uStack_12c;
          *(undefined4 *)(plVar12 + 3) = uStack_128;
          *(undefined4 *)((long)plVar12 + 0x1c) = uStack_124;
        }
        else {
          *plVar12 = (long)local_140;
          plVar12[2] = CONCAT44(uStack_12c,local_130);
        }
        plVar12[1] = local_138;
        local_138 = 0;
        local_130 = local_130 & 0xffffff00;
        local_140 = &local_130;
        __cxa_throw(plVar12,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      pfVar11 = std::
                function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                ::target<cs::function>(&pcVar9->mFunc);
      local_170.mDat = (poVar8->object).mDat;
      if (local_170.mDat != (proxy *)0x0) {
        (local_170.mDat)->refcount = (local_170.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_170;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_90,__l,&local_171);
      fiber_callable::fiber_callable(&local_100,pfVar11,&local_90,args);
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_d8._M_unused._M_object = operator_new(0x28);
      *(context_t **)local_d8._M_unused._0_8_ = local_100.context;
      *(function **)((long)local_d8._M_unused._0_8_ + 8) = local_100.func;
      *(pointer *)((long)local_d8._M_unused._0_8_ + 0x10) =
           local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)local_d8._M_unused._0_8_ + 0x18) =
           local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)((long)local_d8._M_unused._0_8_ + 0x20) =
           local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcStack_c0 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::
                   _M_invoke;
      local_c8 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::
                 _M_manager;
      rVar6 = fiber::create(&pfVar11->mContext,(function<void_()> *)&local_d8);
      local_168.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_168.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_168.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_168.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_168.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00333230;
      local_168.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (local_168.
                super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1);
      *(routine_t *)
       &local_168.
        super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._vptr__Sp_counted_base = rVar6;
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_168);
      if (local_168.
          super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168.
                   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_100.args);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_90);
      any::recycle(&local_170);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
    return (var)(proxy *)this;
  }
  pcVar9 = any::const_val<cs::callable>(func);
  ptVar10 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            ::target_type(&pcVar9->mFunc);
  pcVar1 = *(char **)(ptVar10 + 8);
  if ((pcVar1 != "N2cs8functionE") &&
     ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8functionE"), iVar5 != 0)))) {
    plVar12 = (long *)__cxa_allocate_exception(0x20);
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Only can create coroutine from covscript function.","");
    *plVar12 = (long)(plVar12 + 2);
    if (local_120 == &local_110) {
      *(uint *)(plVar12 + 2) = local_110;
      *(undefined4 *)((long)plVar12 + 0x14) = uStack_10c;
      *(undefined4 *)(plVar12 + 3) = uStack_108;
      *(undefined4 *)((long)plVar12 + 0x1c) = uStack_104;
    }
    else {
      *plVar12 = (long)local_120;
      plVar12[2] = CONCAT44(uStack_10c,local_110);
    }
    plVar12[1] = local_118;
    local_118 = 0;
    local_110 = local_110 & 0xffffff00;
    local_120 = &local_110;
    __cxa_throw(plVar12,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  pfVar11 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            ::target<cs::function>(&pcVar9->mFunc);
  local_58._M_cur =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_58._M_first =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_58._M_last =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_58._M_node =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_78._M_cur =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_78._M_last =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
            ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_158,&local_58,&local_78,
             (allocator_type *)&local_170);
  paVar4 = local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  paVar3 = local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar2 = local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_100.context = &pfVar11->mContext;
  local_100.func = pfVar11;
  local_b8._M_unused._M_object = operator_new(0x28);
  *(context_t **)local_b8._M_unused._0_8_ = local_100.context;
  *(function **)((long)local_b8._M_unused._0_8_ + 8) = local_100.func;
  *(pointer *)((long)local_b8._M_unused._0_8_ + 0x10) = paVar2;
  *(pointer *)((long)local_b8._M_unused._0_8_ + 0x18) = paVar3;
  *(pointer *)((long)local_b8._M_unused._0_8_ + 0x20) = paVar4;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_a0 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::_M_invoke;
  local_a8 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::_M_manager;
  rVar6 = fiber::create(&pfVar11->mContext,(function<void_()> *)&local_b8);
  local_168.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_168.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_168.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_168.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_168.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00333230
  ;
  local_168.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (local_168.
          super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi + 1);
  *(routine_t *)
   &local_168.
    super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = rVar6;
  any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_168);
  if (local_168.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.
               super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_100.args);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_158);
  return (var)(proxy *)this;
}

Assistant:

var create_co_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, vector(args.begin(), args.end()))));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object}, args)));
			}
			return null_pointer;
		}